

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O3

size_t __thiscall io_buf::buf_read(io_buf *this,char **pointer,size_t n)

{
  char *pcVar1;
  int *piVar2;
  ssize_t sVar3;
  ulong uVar4;
  char *__src;
  char *pcVar5;
  
  pcVar5 = (this->space)._end;
  __src = this->head;
  while( true ) {
    if (__src + n <= pcVar5) {
      *pointer = __src;
      this->head = this->head + n;
      return n;
    }
    pcVar1 = (this->space)._begin;
    if (__src != pcVar1) {
      memmove(pcVar1,__src,(long)pcVar5 - (long)__src);
      pcVar1 = (this->space)._begin;
      this->head = pcVar1;
      (this->space)._end = pcVar1 + ((long)pcVar5 - (long)__src);
    }
    sVar3 = fill(this,(this->files)._begin[this->current]);
    if ((sVar3 < 1) &&
       (piVar2 = (this->files)._end, uVar4 = this->current + 1, this->current = uVar4,
       (ulong)((long)piVar2 - (long)(this->files)._begin >> 2) <= uVar4)) break;
    pcVar5 = (this->space)._end;
    __src = this->head;
  }
  *pointer = this->head;
  pcVar5 = (this->space)._end;
  this->head = pcVar5;
  return (long)pcVar5 - (long)*pointer;
}

Assistant:

size_t io_buf::buf_read(char*& pointer, size_t n)
{
  // return a pointer to the next n bytes.  n must be smaller than the maximum size.
  if (head + n <= space.end())
  {
    pointer = head;
    head += n;
    return n;
  }
  else  // out of bytes, so refill.
  {
    if (head != space.begin())  // There exists room to shift.
    {
      // Out of buffer so swap to beginning.
      size_t left = space.end() - head;
      memmove(space.begin(), head, left);
      head = space.begin();
      space.end() = space.begin() + left;
    }
    if (fill(files[current]) > 0)   // read more bytes from current file if present
      return buf_read(pointer, n);  // more bytes are read.
    else if (++current < files.size())
      return buf_read(pointer, n);  // No more bytes, so go to next file and try again.
    else
    {
      // no more bytes to read, return all that we have left.
      pointer = head;
      head = space.end();
      return space.end() - pointer;
    }
  }
}